

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O1

void __thiscall Random_keys::geraPopAleatoria(Random_keys *this,Graph *g)

{
  pointer *pppRVar1;
  iterator __position;
  RK_Individual *in_RAX;
  RK_Individual *this_00;
  int iVar2;
  RK_Individual *ind;
  RK_Individual *local_38;
  
  local_38 = in_RAX;
  Graph::markOneDirectionInEdges(g);
  if (0 < this->tamPop) {
    iVar2 = 0;
    do {
      this_00 = (RK_Individual *)operator_new(0x28);
      RK_Individual::RK_Individual(this_00,g->edgesSize / 2 - g->numberOfNonModifiable);
      local_38 = this_00;
      RK_Individual::generate_random_weights(this_00);
      __position._M_current =
           (this->popAtual).super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->popAtual).super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<RK_Individual*,std::allocator<RK_Individual*>>::
        _M_realloc_insert<RK_Individual*const&>
                  ((vector<RK_Individual*,std::allocator<RK_Individual*>> *)&this->popAtual,
                   __position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        pppRVar1 = &(this->popAtual).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppRVar1 = *pppRVar1 + 1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->tamPop);
  }
  std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=
            (&this->popAnterior,&this->popAtual);
  return;
}

Assistant:

void Random_keys::geraPopAleatoria(Graph *g){

    g->markOneDirectionInEdges();
    RK_Individual *ind;
    for(int i=0; i<this->tamPop; i++){

        ind = new RK_Individual(g->getEdgesSizes() / 2 - g->getNumberOfNonModifiable());
        ind->generate_random_weights();

        popAtual.push_back(ind);
    }
    popAnterior = popAtual;
}